

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-parse.h
# Opt level: O0

pair<unsigned_long,_const_char_*> parseunsigned<char_const*>(char *first,char *last,int base)

{
  pair<int,_const_char_*> pVar1;
  int local_7c;
  pair<int,_const_char_*> local_78;
  int local_64;
  pair<int,_const_char_*> local_60;
  int local_4c;
  char *pcStack_48;
  int n;
  char *p;
  uint64_t num;
  int local_30;
  int digits;
  int state;
  int base_local;
  char *last_local;
  char *first_local;
  
  local_30 = 0;
  num._4_4_ = 0;
  p = (char *)0x0;
  pcStack_48 = first;
  digits = base;
  _state = last;
  last_local = first;
  do {
    if (_state <= pcStack_48) {
LAB_00105894:
      if (local_30 == 2) {
        local_64 = 0;
        pVar1 = std::make_pair<int,char_const*&>(&local_64,&last_local);
        local_60.second = pVar1.second;
        local_60.first = pVar1.first;
        std::pair<unsigned_long,_const_char_*>::pair<int,_const_char_*,_true>
                  ((pair<unsigned_long,_const_char_*> *)&first_local,&local_60);
      }
      else if ((local_30 == 3) && (num._4_4_ == 0)) {
        local_7c = 0;
        pVar1 = std::make_pair<int,char_const*&>(&local_7c,&last_local);
        local_78.second = pVar1.second;
        local_78.first = pVar1.first;
        std::pair<unsigned_long,_const_char_*>::pair<int,_const_char_*,_true>
                  ((pair<unsigned_long,_const_char_*> *)&first_local,&local_78);
      }
      else {
        _first_local = std::make_pair<unsigned_long&,char_const*&>
                                 ((unsigned_long *)&p,&stack0xffffffffffffffb8);
      }
      return _first_local;
    }
    local_4c = char2nyble<char>(*pcStack_48);
    if (digits == 0) {
      if (local_30 == 0) {
        if ((local_4c < 1) || (9 < local_4c)) {
          if (local_4c != 0) {
            local_30 = 2;
            goto LAB_00105894;
          }
          local_30 = 1;
        }
        else {
          digits = 10;
          local_30 = 3;
          p = (char *)(long)local_4c;
          num._4_4_ = 1;
        }
      }
      else {
        if (local_30 != 1) {
          local_30 = 2;
          goto LAB_00105894;
        }
        if (*pcStack_48 == 'x') {
          digits = 0x10;
          local_30 = 3;
        }
        else if (*pcStack_48 == 'b') {
          digits = 2;
          local_30 = 3;
        }
        else {
          if (local_4c == -1) goto LAB_00105894;
          if ((local_4c < 0) || (7 < local_4c)) {
            if (7 < local_4c) {
              local_30 = 2;
              goto LAB_00105894;
            }
          }
          else {
            digits = 8;
            local_30 = 3;
            p = (char *)(long)local_4c;
            num._4_4_ = 1;
          }
        }
      }
    }
    else {
      if ((local_4c < 0) || (digits <= local_4c)) goto LAB_00105894;
      p = (char *)((long)local_4c + (long)digits * (long)p);
      num._4_4_ = num._4_4_ + 1;
    }
    pcStack_48 = pcStack_48 + 1;
  } while( true );
}

Assistant:

std::pair<uint64_t, P> parseunsigned(P first, P last, int base)
{
    int state = 0;    // 3 = foundbase, 2 = invalid, 1 = found '0', 0 = initial state.
    int digits = 0;
    uint64_t num = 0;
    auto p = first;
    while (p<last)
    {
        int n = char2nyble(*p);
        if (base==0) {
            if (state==0) {
                if (1<=n && n<=9) {
                    base = 10;
                    state = 3;
                    num = n;  // this is the first real digit
                    digits = 1;
                }
                else if (n==0) {
                    // expect 0<octal>, 0b<binary>, 0x<hex>
                    state = 1;
                }
                else {
                    // invalid
                    state = 2;
                    break;
                }
            }
            else if (state==1) {
                if (*p == 'x') {
                    base = 16;
                    state = 3;
                }
                else if (*p == 'b') {
                    base = 2;
                    state = 3;
                }
                else if (n==-1) {
                    // just a single '0' followed by a non digit
                    // -> return '0'
                    break;
                }
                else if (0<=n && n<=7) {
                    base = 8;
                    state = 3;
                    num = n;  // this is the first real digit
                    digits = 1;
                }
                else if (n>=8) {
                    // invalid octal digit
                    state = 2;
                    break;
                }
            }
            else {
                // invalid
                state = 2;
                break;
            }
        }
        else {
            if (n<0 || n>=base) {
                // end of number
                break;
            }
            num *= base;
            num += n;
            digits++;
        }

        ++p;
    }
    if (state==2)  // invalid
        return std::make_pair(0, first);

    if (state==3 && digits==0) {
        // "0x" and "0b" are invalid numbers, they expect digits.
        return std::make_pair(0, first);
    }
    return std::make_pair(num, p);
}